

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O3

void __thiscall w3Interp::Local_tee(w3Interp *this)

{
  w3Frame **ppwVar1;
  ulong uVar2;
  w3Stack *pwVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  w3Tag extraout_AL;
  w3Tag wVar5;
  undefined8 extraout_RAX;
  w3Frame *pwVar6;
  ulong uVar7;
  ulong uVar8;
  w3Stack *unaff_R15;
  undefined1 local_40 [32];
  
  uVar7 = (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32;
  uVar8 = uVar7;
  if (uVar7 < this->frame->param_and_local_count) {
    uVar2 = this->frame->param_count;
    unaff_R15 = &this->super_w3Stack;
    w3Stack::AssertTopIsValue(unaff_R15);
    pwVar6 = this->frame;
    wVar5 = (this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
            super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].value.tag;
    if (uVar7 < uVar2) {
      if (wVar5 != pwVar6->param_types[uVar7]) {
        w3Stack::AssertTopIsValue(unaff_R15);
        pwVar3 = &this->super_w3Stack;
        pwVar6 = (w3Frame *)(ulong)this->frame->param_types[uVar7];
        this = (w3Interp *)local_40;
        StringFormat_abi_cxx11_
                  ((string *)this,"%X %lX",
                   (ulong)(pwVar3->super_w3StackBase).super_w3StackBaseBase.
                          super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                          super__Vector_impl_data._M_finish[-1].value.tag);
        AssertFailedFormat("tag () == frame->param_types [i]",(string *)this);
        wVar5 = extraout_AL;
        goto LAB_0011a38a;
      }
    }
    else {
LAB_0011a38a:
      if (wVar5 != pwVar6->local_only_types[uVar7 - pwVar6->param_count]) goto LAB_0011a491;
    }
    w3Stack::AssertTopIsValue(unaff_R15);
    uVar8 = uVar7 * 0x30;
    if (*(char *)(*(long *)((long)&this->super_w3Stack + 8) + -0x28) ==
        *(char *)((long)((this->frame->interp->stack->super_w3StackBase).super_w3StackBaseBase.
                         super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                         super__Vector_impl_data._M_start + this->frame->locals + uVar7) + 8)) {
      w3Stack::AssertTopIsValue(unaff_R15);
      *(undefined8 *)
       ((long)((this->frame->interp->stack->super_w3StackBase).super_w3StackBaseBase.
               super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
               super__Vector_impl_data._M_start + this->frame->locals + uVar7) + 0x10) =
           *(undefined8 *)(*(long *)((long)&this->super_w3Stack + 8) + -0x20);
      return;
    }
  }
  else {
    this = (w3Interp *)local_40;
    StringFormat_abi_cxx11_((string *)this,"%lX %lX",uVar7);
    AssertFailedFormat("i < frame->param_and_local_count",(string *)this);
  }
  w3Stack::AssertTopIsValue(unaff_R15);
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&this->super_w3Stack;
  ppwVar1 = &this->frame;
  this = (w3Interp *)local_40;
  StringFormat_abi_cxx11_
            ((string *)this,"%X %X",(ulong)*(byte *)(*(long *)((long)paVar4 + 8) + -0x28),
             (ulong)*(byte *)((long)(((*ppwVar1)->interp->stack->super_w3StackBase).
                                     super_w3StackBaseBase.
                                     super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>
                                     ._M_impl.super__Vector_impl_data._M_start + (*ppwVar1)->locals)
                              + 8U + uVar8));
  AssertFailedFormat("tag () == frame->Local (i).value.tag",(string *)this);
LAB_0011a491:
  w3Stack::AssertTopIsValue(unaff_R15);
  StringFormat_abi_cxx11_
            ((string *)local_40,"%X %X",
             (ulong)*(byte *)(*(long *)((long)&this->super_w3Stack + 8) + -0x28),
             (ulong)this->frame->local_only_types[uVar8 - this->frame->param_count]);
  AssertFailedFormat("tag () == frame->local_only_types [i - frame->param_count]",(string *)local_40
                    );
  if ((undefined1 *)local_40._0_8_ != local_40 + 0x10) {
    operator_delete((void *)local_40._0_8_,(ulong)(local_40._16_8_ + 1));
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

INTERP (Local_tee)
{
    //__debugbreak ();
    const size_t i = instr->u32;
    AssertFormat (i < frame->param_and_local_count, ("%" FORMAT_SIZE "X %" FORMAT_SIZE "X", i, frame->param_and_local_count));
    if (i < frame->param_count)
        AssertFormat (tag () == frame->param_types [i], ("%X %" FORMAT_SIZE "X", tag (), frame->param_types [i]));
    else
        AssertFormat (tag () == frame->local_only_types [i - frame->param_count], ("%X %X", tag (), frame->local_only_types [i - frame->param_count]));
    AssertFormat (tag () == frame->Local (i).value.tag, ("%X %X", tag (), frame->Local (i).value.tag));
    frame->Local (i).value.value = value ();
}